

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O0

ostream * plot::detail::
          output_vbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>,std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                    (ostream *stream,size_t width,
                    tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                    *first,tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
                           *rest)

{
  bool bVar1;
  _Setw _Var2;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *pbVar3;
  block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
  *other;
  reference line;
  ostream *poVar4;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *block;
  Size SVar5;
  ostream *local_50;
  tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  *rest_local;
  tuple<const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_&,_const_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_&>
  *first_local;
  size_t width_local;
  ostream *stream_local;
  
  pbVar3 = std::
           get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>
                     (first);
  other = std::
          get<1ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>
                    (first);
  bVar1 = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          ::operator!=(pbVar3,other);
  if (bVar1) {
    pbVar3 = std::
             get<0ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>
                       (first);
    line = block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           ::operator*(pbVar3);
    poVar4 = operator<<(stream,line);
    block = std::
            get<2ul,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>
                      (first);
    SVar5 = normal_block_ref_traits<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_true>::
            size(block);
    _Var2 = std::setw((int)width - (int)SVar5.x);
    poVar4 = std::operator<<(poVar4,_Var2);
    local_50 = std::operator<<(poVar4,"");
  }
  else {
    local_50 = output_vbox_line<std::tuple<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>const&,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>const&>>
                         (stream,width,rest);
  }
  return local_50;
}

Assistant:

inline std::ostream& output_vbox_line(std::ostream& stream, std::size_t width, Arg&& first, Args&&... rest) {
        return (std::get<0>(std::forward<Arg>(first)) != std::get<1>(std::forward<Arg>(first)))
            ? (stream << *std::get<0>(std::forward<Arg>(first))
                      << std::setw(width - detail::block_traits<std::decay_t<std::tuple_element_t<2, std::decay_t<Arg>>>>
                          ::size(std::get<2>(std::forward<Arg>(first))).x) << u8"")
            : output_vbox_line(stream, width, std::forward<Args>(rest)...);
    }